

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O3

void cfd::core::logger::log<std::__cxx11::string&,char_const*&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char **args_1
               )

{
  char cVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  pointer local_48;
  size_type sStack_40;
  char *local_38;
  
  cVar1 = cfd::core::logger::IsEnableLogLevel(lvl);
  if (cVar1 != '\0') {
    local_48 = (args->_M_dataplus)._M_p;
    sStack_40 = args->_M_string_length;
    local_38 = *args_1;
    sVar2 = strlen(fmt);
    ::fmt::v7::detail::vformat_abi_cxx11_(local_68,fmt,sVar2,0xcd,&local_48);
    cfd::core::logger::WriteLog(source,lvl,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}